

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O0

void __thiscall
Imf_2_5::TypedAttribute<Imath_2_5::Matrix44<float>_>::copyValueFrom
          (TypedAttribute<Imath_2_5::Matrix44<float>_> *this,Attribute *other)

{
  TypedAttribute<Imath_2_5::Matrix44<float>_> *pTVar1;
  long in_RDI;
  
  pTVar1 = cast((Attribute *)0x5840c1);
  Imath_2_5::Matrix44<float>::operator=((Matrix44<float> *)(in_RDI + 8),&pTVar1->_value);
  return;
}

Assistant:

void		
TypedAttribute<T>::copyValueFrom (const Attribute &other)
{
    _value = cast(other)._value;
}